

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

string * __thiscall Node::ParenString_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  char cVar1;
  allocator local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  cVar1 = *(this->TextValue)._M_dataplus._M_p;
  if ((cVar1 == '\'') || (cVar1 == '\"')) {
    std::__cxx11::string::string((string *)&local_50,"std::string(",&local_71);
    Expression_abi_cxx11_(&local_70,this);
    std::operator+(&local_30,&local_50,&local_70);
    std::operator+(__return_storage_ptr__,&local_30,")");
  }
  else {
    if ((this->Type != 0x2d) && (this->Type != 0x2b)) {
      Expression_abi_cxx11_(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_50,"(",&local_71);
    Expression_abi_cxx11_(&local_70,this);
    std::operator+(&local_30,&local_50,&local_70);
    std::operator+(__return_storage_ptr__,&local_30,")");
  }
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::ParenString(void)
{
	if (TextValue[0] == '"' || TextValue[0] == '\'')
	{
		return std::string("std::string(") +
			Expression() + ")";
	}
	else
	{
		switch(Type)
		{
		// Add other operations as needed
		case '+':
		case '-':
			return std::string("(") + Expression() + ")";

	//	case  '(':
		default:
			return Expression();
		}
	}
}